

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::UnitTestOptions::FilterMatchesTest(string *test_case_name,string *test_name)

{
  size_type *psVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  _Alloc_hider _Var8;
  string *this;
  size_type *psVar9;
  long *local_b0 [2];
  long local_a0 [2];
  size_type *local_90;
  string negative;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_type *local_50;
  string positive;
  
  psVar1 = &positive._M_string_length;
  pcVar2 = (test_case_name->_M_dataplus)._M_p;
  local_50 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + test_case_name->_M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  negative.field_2._8_8_ = &local_60;
  psVar9 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar9) {
    local_60._M_allocated_capacity = *psVar9;
    local_60._8_8_ = plVar4[3];
  }
  else {
    local_60._M_allocated_capacity = *psVar9;
    negative.field_2._8_8_ = (size_type *)*plVar4;
  }
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_50 != psVar1) {
    operator_delete(local_50,CONCAT71(positive._M_string_length._1_7_,
                                      (undefined1)positive._M_string_length) + 1);
  }
  pcVar7 = FLAGS_gtest_filter_abi_cxx11_;
  pcVar5 = strchr(FLAGS_gtest_filter_abi_cxx11_,0x2d);
  positive._M_dataplus._M_p = (pointer)0x0;
  positive._M_string_length._0_1_ = 0;
  local_90 = &negative._M_string_length;
  negative._M_dataplus._M_p = (pointer)0x0;
  negative._M_string_length._0_1_ = 0;
  if (pcVar5 == (char *)0x0) {
    local_50 = psVar1;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar7);
    pcVar7 = "";
    this = (string *)&local_90;
    _Var8 = negative._M_dataplus;
  }
  else {
    local_b0[0] = local_a0;
    local_50 = psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar7,pcVar5);
    this = (string *)&local_50;
    std::__cxx11::string::operator=(this,(string *)local_b0);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    local_b0[0] = local_a0;
    sVar6 = strlen(pcVar5 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,pcVar5 + 1,pcVar5 + sVar6 + 1);
    std::__cxx11::string::operator=((string *)&local_90,(string *)local_b0);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    if (positive._M_dataplus._M_p != (pointer)0x0) goto LAB_00120e20;
    pcVar7 = "*";
    _Var8._M_p = (char *)0x0;
  }
  std::__cxx11::string::_M_replace((ulong)this,0,_Var8._M_p,(ulong)pcVar7);
LAB_00120e20:
  psVar9 = local_50;
  bVar3 = MatchesFilter((string *)((long)&negative.field_2 + 8),(char *)local_50);
  psVar1 = local_90;
  if (bVar3) {
    bVar3 = MatchesFilter((string *)((long)&negative.field_2 + 8),(char *)local_90);
    bVar3 = !bVar3;
  }
  else {
    bVar3 = false;
  }
  if (psVar1 != &negative._M_string_length) {
    operator_delete(psVar1,CONCAT71(negative._M_string_length._1_7_,
                                    (undefined1)negative._M_string_length) + 1);
    psVar9 = local_50;
  }
  if (psVar9 != &positive._M_string_length) {
    operator_delete(psVar9,CONCAT71(positive._M_string_length._1_7_,
                                    (undefined1)positive._M_string_length) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)negative.field_2._8_8_ != &local_60) {
    operator_delete((void *)negative.field_2._8_8_,local_60._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string &test_case_name,
                                        const std::string &test_name) {
  const std::string& full_name = test_case_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == NULL) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}